

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonString.cpp
# Opt level: O0

JsonString * __thiscall json::JsonString::escaped_abi_cxx11_(JsonString *this)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  long in_RSI;
  ulong local_28;
  size_t i;
  JsonString *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)this);
  for (local_28 = 0; uVar2 = std::__cxx11::string::length(), local_28 < uVar2;
      local_28 = local_28 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI + 0x10);
    cVar1 = *pcVar3;
    if (cVar1 == '\b') {
      std::__cxx11::string::operator+=((string *)this,"\\b");
    }
    else if (cVar1 == '\t') {
      std::__cxx11::string::operator+=((string *)this,"\\t");
    }
    else if (cVar1 == '\n') {
      std::__cxx11::string::operator+=((string *)this,"\\n");
    }
    else if (cVar1 == '\f') {
      std::__cxx11::string::operator+=((string *)this,"\\f");
    }
    else if (cVar1 == '\r') {
      std::__cxx11::string::operator+=((string *)this,"\\r");
    }
    else if (cVar1 == '\"') {
      std::__cxx11::string::operator+=((string *)this,"\\\"");
    }
    else if (cVar1 == '\\') {
      std::__cxx11::string::operator+=((string *)this,"\\\\");
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI + 0x10);
      std::__cxx11::string::operator+=((string *)this,*pcVar3);
    }
  }
  return this;
}

Assistant:

std::string JsonString::escaped() const noexcept
    {
        std::string result;

        // Go through each character and check if one of them need to be escaped.
        for (size_t i = 0; i < value.length(); i++)
        {
            switch (value[i])
            {
            case '\"':
                result += "\\\"";
                break;
            case '\\':
                result += "\\\\";
                break;
            case '\b':
                result += "\\b";
                break;
            case '\f':
                result += "\\f";
                break;
            case '\n':
                result += "\\n";
                break;
            case '\r':
                result += "\\r";
                break;
            case '\t':
                result += "\\t";
                break;
            default:
                result += value[i];
                break;
            }
        }

        return result;
    }